

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsATimes(void *cvode_mem,N_Vector v,N_Vector z)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  int retval;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                            (CVodeMem *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            (CVLsMem *)0x11f7ae);
  if (local_4 == 0) {
    local_4 = (**(code **)(in_stack_ffffffffffffffd0 + 0x108))
                        (*(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x168),in_RSI,in_RDX,
                         *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x70),
                         *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x78),
                         *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x118),
                         *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x60));
    *(long *)(in_stack_ffffffffffffffd0 + 200) = *(long *)(in_stack_ffffffffffffffd0 + 200) + 1;
    if (local_4 == 0) {
      N_VLinearSum(0x3ff0000000000000,
                   *(ulong *)((long)in_stack_ffffffffffffffd8 + 0x288) ^ 0x8000000000000000,in_RSI,
                   in_RDX,in_RDX);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int cvLsATimes(void* cvode_mem, N_Vector v, N_Vector z)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* call Jacobian-times-vector product routine
     (either user-supplied or internal DQ) */
  retval = cvls_mem->jtimes(v, z, cv_mem->cv_tn, cvls_mem->ycur, cvls_mem->fcur,
                            cvls_mem->jt_data, cvls_mem->ytemp);
  cvls_mem->njtimes++;
  if (retval != 0) { return (retval); }

  /* add contribution from identity matrix */
  N_VLinearSum(ONE, v, -cv_mem->cv_gamma, z, z);

  return (0);
}